

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall xmrig::Client::reconnect(Client *this)

{
  long in_RDI;
  Client *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    Storage<xmrig::Client>::remove((Storage<xmrig::Client> *)m_storage,*(char **)(in_RDI + 0x4ad0));
  }
  else {
    *(undefined8 *)(in_RDI + 0x4ac8) = 0;
    if (*(long *)(in_RDI + 0x20) == -1) {
      (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))(*(long **)(in_RDI + 0x10),in_RDI,0xffffffff);
    }
    else {
      setState(unaff_retaddr,(SocketState)((ulong)in_RDI >> 0x20));
      *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
      (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))
                (*(long **)(in_RDI + 0x10),in_RDI,*(ulong *)(in_RDI + 0x20) & 0xffffffff);
    }
  }
  return;
}

Assistant:

void xmrig::Client::reconnect()
{
    if (!m_listener) {
        m_storage.remove(m_key);

        return;
    }

    m_keepAlive = 0;

    if (m_failures == -1) {
        return m_listener->onClose(this, -1);
    }

    setState(ReconnectingState);

    m_failures++;
    m_listener->onClose(this, static_cast<int>(m_failures));
}